

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O1

void __thiscall
flow::diagnostics::Report::tokenError<std::__cxx11::string,unsigned_long,unsigned_long,int>
          (Report *this,SourceLocation *sloc,string *f,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_long args_1,unsigned_long args_2,int args_3)

{
  pointer pcVar1;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  string local_2e8;
  SourceLocation local_2c8;
  undefined **local_290;
  undefined1 *local_288;
  long lStack_280;
  ulong local_278;
  undefined1 local_270 [504];
  pointer local_78;
  size_type sStack_70;
  unsigned_long local_68;
  unsigned_long local_58;
  ulong local_48;
  
  local_2c8.filename._M_dataplus._M_p = (pointer)&local_2c8.filename.field_2;
  pcVar1 = (sloc->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,pcVar1,pcVar1 + (sloc->filename)._M_string_length);
  local_2c8.end.column = (sloc->end).column;
  local_2c8.end.offset = (sloc->end).offset;
  local_2c8.begin.line = (sloc->begin).line;
  local_2c8.begin.column = (sloc->begin).column;
  local_2c8._40_8_ = *(undefined8 *)&(sloc->begin).offset;
  format_str.data_ = (f->_M_dataplus)._M_p;
  format_str.size_ = f->_M_string_length;
  local_78 = (args->_M_dataplus)._M_p;
  sStack_70 = args->_M_string_length;
  local_48 = (ulong)(uint)args_3;
  lStack_280 = 0;
  local_290 = &PTR_grow_00194440;
  local_278 = 500;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_78;
  args_00.types_ = 0x255b;
  local_288 = local_270;
  local_68 = args_1;
  local_58 = args_2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_290,format_str,args_00);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,local_288,local_288 + lStack_280);
  local_290 = &PTR_grow_00194440;
  if (local_288 != local_270) {
    operator_delete(local_288,local_278);
  }
  emplace_back(this,TokenError,&local_2c8,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.filename._M_dataplus._M_p != &local_2c8.filename.field_2) {
    operator_delete(local_2c8.filename._M_dataplus._M_p,
                    local_2c8.filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void tokenError(const SourceLocation& sloc, const std::string& f, Args... args) {
    emplace_back(Type::TokenError, sloc, fmt::format(f, std::move(args)...));
  }